

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::DefaultPrintTo<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
               (undefined8 param_1,ulong *param_2,ostream *param_3)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  wchar_t *value;
  
  std::operator<<(param_3,"{");
  uVar1 = *param_2;
  value = (wchar_t *)param_2[1];
  lVar2 = uVar1 * 4;
  lVar3 = 0;
  do {
    if (lVar2 == 0) {
      if ((uVar1 & 0x3fffffffffffffff) != 0) {
LAB_001b3dcb:
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((lVar3 != 0) && (std::operator<<(param_3,","), lVar3 == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_001b3dcb;
    }
    std::operator<<(param_3," ");
    UniversalPrintTo<wchar_t>(value,param_3);
    value = value + 1;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + -4;
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                           , iutest_type_traits::false_type
                           , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}